

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_table_filter.cpp
# Opt level: O3

unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> __thiscall
duckdb::ConstantFilter::Deserialize(ConstantFilter *this,Deserializer *deserializer)

{
  ExpressionType comparison_type_p;
  int iVar1;
  ConstantFilter *this_00;
  Value constant;
  Value local_a0;
  Value local_60;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"comparison_type");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_a0,deserializer);
    comparison_type_p = EnumUtil::FromString<duckdb::ExpressionType>((char *)local_a0.type_._0_8_);
    if ((char **)local_a0.type_._0_8_ != (char **)((long)&local_a0 + 0x10U)) {
      operator_delete((void *)local_a0.type_._0_8_);
    }
  }
  else {
    iVar1 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    comparison_type_p = (ExpressionType)iVar1;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"constant");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  Value::Deserialize(&local_a0,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (ConstantFilter *)operator_new(0x50);
  Value::Value(&local_60,&local_a0);
  ConstantFilter(this_00,comparison_type_p,&local_60);
  Value::~Value(&local_60);
  (this->super_TableFilter)._vptr_TableFilter = (_func_int **)this_00;
  Value::~Value(&local_a0);
  return (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)
         (unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>_>)this;
}

Assistant:

unique_ptr<TableFilter> ConstantFilter::Deserialize(Deserializer &deserializer) {
	auto comparison_type = deserializer.ReadProperty<ExpressionType>(200, "comparison_type");
	auto constant = deserializer.ReadProperty<Value>(201, "constant");
	auto result = duckdb::unique_ptr<ConstantFilter>(new ConstantFilter(comparison_type, constant));
	return std::move(result);
}